

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_exhaustive.c
# Opt level: O0

int secp256k1_nonce_function_smallint
              (uchar *nonce32,uchar *msg32,uchar *key32,uchar *algo16,void *data,uint attempt)

{
  secp256k1_scalar *in_R8;
  int in_R9D;
  int *idata;
  secp256k1_scalar s;
  undefined4 in_stack_ffffffffffffffd0;
  
  if (in_R9D != 0) {
    *in_R8 = (int)(*in_R8 + 1) % 0xd;
  }
  secp256k1_scalar_set_int
            ((secp256k1_scalar *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
             (uint)((ulong)in_R8 >> 0x20));
  secp256k1_scalar_get_b32((uchar *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),in_R8);
  return 1;
}

Assistant:

static int secp256k1_nonce_function_smallint(unsigned char *nonce32, const unsigned char *msg32,
                                      const unsigned char *key32, const unsigned char *algo16,
                                      void *data, unsigned int attempt) {
    secp256k1_scalar s;
    int *idata = data;
    (void)msg32;
    (void)key32;
    (void)algo16;
    /* Some nonces cannot be used because they'd cause s and/or r to be zero.
     * The signing function has retry logic here that just re-calls the nonce
     * function with an increased `attempt`. So if attempt > 0 this means we
     * need to change the nonce to avoid an infinite loop. */
    if (attempt > 0) {
        *idata = (*idata + 1) % EXHAUSTIVE_TEST_ORDER;
    }
    secp256k1_scalar_set_int(&s, *idata);
    secp256k1_scalar_get_b32(nonce32, &s);
    return 1;
}